

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,int param_3,
               uint param_4)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  int *piVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  int __tmp_9;
  long lVar9;
  int *piVar10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  int *piVar14;
  ulong uVar15;
  long lVar16;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var17;
  int *piVar18;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar19;
  _Iter_comp_iter<std::less<int>_> __cmp;
  _Iter_comp_iter<std::less<int>_> __cmp_1;
  _Iter_comp_iter<std::less<int>_> local_32;
  _Iter_comp_iter<std::less<int>_> local_31;
  
  do {
    uVar13 = (long)end._M_current - (long)begin._M_current >> 2;
    if ((long)uVar13 < 0x18) {
      piVar7 = begin._M_current + 1;
      if ((param_4 & 1) == 0) {
        _Var8._M_current = begin._M_current;
        if (piVar7 != end._M_current && begin._M_current != end._M_current) {
          do {
            piVar11 = piVar7;
            iVar2 = _Var8._M_current[1];
            piVar7 = piVar11;
            if (iVar2 < *_Var8._M_current) {
              do {
                *piVar7 = piVar7[-1];
                piVar18 = piVar7 + -1;
                piVar14 = piVar7 + -2;
                piVar7 = piVar18;
              } while (iVar2 < *piVar14);
              *piVar18 = iVar2;
            }
            piVar7 = piVar11 + 1;
            _Var8._M_current = piVar11;
          } while (piVar11 + 1 != end._M_current);
        }
      }
      else if (piVar7 != end._M_current && begin._M_current != end._M_current) {
        lVar12 = 4;
        _Var8._M_current = begin._M_current;
        do {
          piVar11 = piVar7;
          iVar2 = _Var8._M_current[1];
          lVar16 = lVar12;
          if (iVar2 < *_Var8._M_current) {
            do {
              *(undefined4 *)((long)begin._M_current + lVar16) =
                   *(undefined4 *)((long)begin._M_current + lVar16 + -4);
              _Var8._M_current = begin._M_current;
              if (lVar16 == 4) goto LAB_0027dc18;
              lVar9 = lVar16 + -4;
              lVar5 = lVar16 + -8;
              lVar16 = lVar9;
            } while (iVar2 < *(begin._M_current + lVar5));
            _Var8._M_current = lVar9 + begin._M_current;
LAB_0027dc18:
            *_Var8._M_current = iVar2;
          }
          piVar7 = piVar11 + 1;
          lVar12 = lVar12 + 4;
          _Var8._M_current = piVar11;
        } while (piVar7 != end._M_current);
      }
LAB_0027e09a:
      bVar4 = true;
    }
    else {
      uVar6 = uVar13 >> 1;
      if ((long)uVar13 < 0x81) {
        iVar2 = begin._M_current[uVar6];
        if (*begin._M_current < iVar2) {
          begin._M_current[uVar6] = *begin._M_current;
          *begin._M_current = iVar2;
        }
        iVar2 = *begin._M_current;
        if (end._M_current[-1] < iVar2) {
          *begin._M_current = end._M_current[-1];
          end._M_current[-1] = iVar2;
        }
        iVar2 = begin._M_current[uVar6];
        if (*begin._M_current < iVar2) {
          begin._M_current[uVar6] = *begin._M_current;
          *begin._M_current = iVar2;
        }
      }
      else {
        iVar2 = *begin._M_current;
        if (begin._M_current[uVar6] < iVar2) {
          *begin._M_current = begin._M_current[uVar6];
          begin._M_current[uVar6] = iVar2;
        }
        iVar2 = begin._M_current[uVar6];
        if (end._M_current[-1] < iVar2) {
          begin._M_current[uVar6] = end._M_current[-1];
          end._M_current[-1] = iVar2;
        }
        iVar2 = *begin._M_current;
        if (begin._M_current[uVar6] < iVar2) {
          *begin._M_current = begin._M_current[uVar6];
          begin._M_current[uVar6] = iVar2;
        }
        iVar2 = begin._M_current[1];
        if (begin._M_current[uVar6 - 1] < iVar2) {
          begin._M_current[1] = begin._M_current[uVar6 - 1];
          begin._M_current[uVar6 - 1] = iVar2;
        }
        iVar2 = begin._M_current[uVar6 - 1];
        if (end._M_current[-2] < iVar2) {
          begin._M_current[uVar6 - 1] = end._M_current[-2];
          end._M_current[-2] = iVar2;
        }
        iVar2 = begin._M_current[1];
        if (begin._M_current[uVar6 - 1] < iVar2) {
          begin._M_current[1] = begin._M_current[uVar6 - 1];
          begin._M_current[uVar6 - 1] = iVar2;
        }
        iVar2 = begin._M_current[2];
        if (begin._M_current[uVar6 + 1] < iVar2) {
          begin._M_current[2] = begin._M_current[uVar6 + 1];
          begin._M_current[uVar6 + 1] = iVar2;
        }
        iVar2 = begin._M_current[uVar6 + 1];
        if (end._M_current[-3] < iVar2) {
          begin._M_current[uVar6 + 1] = end._M_current[-3];
          end._M_current[-3] = iVar2;
        }
        iVar2 = begin._M_current[2];
        if (begin._M_current[uVar6 + 1] < iVar2) {
          begin._M_current[2] = begin._M_current[uVar6 + 1];
          begin._M_current[uVar6 + 1] = iVar2;
        }
        iVar2 = begin._M_current[uVar6 - 1];
        if (begin._M_current[uVar6] < iVar2) {
          begin._M_current[uVar6 - 1] = begin._M_current[uVar6];
          begin._M_current[uVar6] = iVar2;
        }
        iVar2 = begin._M_current[uVar6];
        if (begin._M_current[uVar6 + 1] < iVar2) {
          begin._M_current[uVar6] = begin._M_current[uVar6 + 1];
          begin._M_current[uVar6 + 1] = iVar2;
        }
        iVar2 = begin._M_current[uVar6 - 1];
        if (begin._M_current[uVar6] < iVar2) {
          begin._M_current[uVar6 - 1] = begin._M_current[uVar6];
          begin._M_current[uVar6] = iVar2;
        }
        iVar2 = *begin._M_current;
        *begin._M_current = begin._M_current[uVar6];
        begin._M_current[uVar6] = iVar2;
      }
      if (((param_4 & 1) == 0) && (iVar2 = *begin._M_current, iVar2 <= begin._M_current[-1])) {
        lVar12 = 0;
        do {
          lVar9 = lVar12 + -4;
          lVar16 = lVar12 + -4;
          lVar12 = lVar9;
        } while (iVar2 < *(end._M_current + lVar16));
        piVar7 = end._M_current + lVar9;
        _Var8._M_current = begin._M_current;
        if (lVar9 == -4) {
          do {
            piVar11 = _Var8._M_current;
            if (piVar7 <= _Var8._M_current) break;
            piVar11 = _Var8._M_current + 1;
            piVar18 = _Var8._M_current + 1;
            _Var8._M_current = piVar11;
          } while (*piVar18 <= iVar2);
        }
        else {
          do {
            piVar11 = _Var8._M_current + 1;
            piVar18 = _Var8._M_current + 1;
            _Var8._M_current = piVar11;
          } while (*piVar18 <= iVar2);
        }
        while (piVar11 < piVar7) {
          iVar3 = *piVar11;
          *piVar11 = *piVar7;
          *piVar7 = iVar3;
          piVar18 = piVar7;
          do {
            piVar7 = piVar18 + -1;
            piVar14 = piVar18 + -1;
            piVar10 = piVar11;
            piVar18 = piVar7;
          } while (iVar2 < *piVar14);
          do {
            piVar18 = piVar10 + 1;
            piVar11 = piVar10 + 1;
            piVar10 = piVar10 + 1;
          } while (*piVar18 <= iVar2);
        }
        *begin._M_current = *piVar7;
        *piVar7 = iVar2;
        begin._M_current = piVar7 + 1;
        bVar4 = false;
      }
      else {
        pVar19 = partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                           (begin._M_current,end._M_current);
        _Var8 = pVar19.first._M_current;
        uVar15 = (long)_Var8._M_current - (long)begin._M_current >> 2;
        piVar7 = _Var8._M_current + 1;
        uVar6 = (long)end._M_current - (long)piVar7 >> 2;
        if (((long)uVar15 < (long)(uVar13 >> 3)) || ((long)uVar6 < (long)(uVar13 >> 3))) {
          param_3 = param_3 + -1;
          if (param_3 == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                      (begin,end,&local_32);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                      (begin,end,&local_31);
            param_3 = 0;
            goto LAB_0027e09a;
          }
          if (0x17 < (long)uVar15) {
            uVar13 = uVar15 & 0xfffffffffffffffc;
            iVar2 = *begin._M_current;
            *begin._M_current = *(begin._M_current + uVar13);
            *(begin._M_current + uVar13) = iVar2;
            iVar2 = _Var8._M_current[-1];
            _Var8._M_current[-1] = *(_Var8._M_current - uVar13);
            *(_Var8._M_current - uVar13) = iVar2;
            if (0x80 < (long)uVar15) {
              uVar15 = uVar15 >> 2;
              iVar2 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar15 + 1];
              begin._M_current[uVar15 + 1] = iVar2;
              iVar2 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar15 + 2];
              begin._M_current[uVar15 + 2] = iVar2;
              iVar2 = _Var8._M_current[-2];
              _Var8._M_current[-2] = _Var8._M_current[~uVar15];
              _Var8._M_current[~uVar15] = iVar2;
              iVar2 = _Var8._M_current[-3];
              _Var8._M_current[-3] = _Var8._M_current[-2 - uVar15];
              _Var8._M_current[-2 - uVar15] = iVar2;
            }
          }
          if (0x17 < (long)uVar6) {
            uVar13 = uVar6 & 0xfffffffffffffffc;
            iVar2 = _Var8._M_current[1];
            _Var8._M_current[1] = *(_Var8._M_current + uVar13 + 4);
            *(_Var8._M_current + uVar13 + 4) = iVar2;
            iVar2 = end._M_current[-1];
            end._M_current[-1] = *(end._M_current - uVar13);
            *(end._M_current - uVar13) = iVar2;
            if (0x80 < (long)uVar6) {
              uVar6 = uVar6 >> 2;
              iVar2 = _Var8._M_current[2];
              _Var8._M_current[2] = _Var8._M_current[uVar6 + 2];
              _Var8._M_current[uVar6 + 2] = iVar2;
              iVar2 = _Var8._M_current[3];
              _Var8._M_current[3] = _Var8._M_current[uVar6 + 3];
              _Var8._M_current[uVar6 + 3] = iVar2;
              iVar2 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar6];
              end._M_current[~uVar6] = iVar2;
              iVar2 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar6];
              end._M_current[-2 - uVar6] = iVar2;
            }
          }
        }
        else if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (begin._M_current == _Var8._M_current) {
LAB_0027dfd3:
            if (piVar7 == end._M_current) goto LAB_0027e09a;
            piVar11 = _Var8._M_current + 2;
            lVar12 = 4;
            lVar16 = 0;
            uVar13 = 0;
            do {
              piVar18 = _Var8._M_current + lVar12 + 4;
              if (piVar18 == end._M_current) {
                bVar4 = true;
                goto LAB_0027e09d;
              }
              iVar2 = *(_Var8._M_current + lVar12 + 4);
              piVar14 = piVar11;
              lVar9 = lVar16;
              if (iVar2 < *(_Var8._M_current + lVar12)) {
                do {
                  *piVar14 = piVar14[-1];
                  piVar10 = piVar7;
                  if (lVar9 == 0) break;
                  piVar10 = piVar14 + -1;
                  piVar1 = piVar14 + -2;
                  piVar14 = piVar10;
                  lVar9 = lVar9 + 4;
                } while (iVar2 < *piVar1);
                *piVar10 = iVar2;
                uVar13 = uVar13 + ((long)piVar18 - (long)piVar10 >> 2);
              }
              lVar12 = lVar12 + 4;
              piVar11 = piVar11 + 1;
              lVar16 = lVar16 + -4;
            } while (uVar13 < 9);
          }
          else {
            lVar12 = 4;
            uVar13 = 0;
            _Var17._M_current = begin._M_current;
            do {
              piVar11 = _Var17._M_current + 1;
              if (piVar11 == _Var8._M_current) goto LAB_0027dfd3;
              iVar2 = _Var17._M_current[1];
              lVar16 = lVar12;
              if (iVar2 < *_Var17._M_current) {
                do {
                  *(undefined4 *)((long)begin._M_current + lVar16) =
                       *(undefined4 *)((long)begin._M_current + lVar16 + -4);
                  _Var17._M_current = begin._M_current;
                  if (lVar16 == 4) goto LAB_0027de61;
                  lVar9 = lVar16 + -4;
                  lVar5 = lVar16 + -8;
                  lVar16 = lVar9;
                } while (iVar2 < *(begin._M_current + lVar5));
                _Var17._M_current = lVar9 + begin._M_current;
LAB_0027de61:
                *_Var17._M_current = iVar2;
                uVar13 = uVar13 + ((long)piVar11 - (long)_Var17._M_current >> 2);
              }
              lVar12 = lVar12 + 4;
              _Var17._M_current = piVar11;
            } while (uVar13 < 9);
          }
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
                  (begin._M_current,_Var8._M_current,param_3);
        bVar4 = false;
        param_4 = 0;
        begin._M_current = piVar7;
      }
    }
LAB_0027e09d:
    if (bVar4) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }